

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O2

void Col_WordClearSynonym(Col_Word word)

{
  Col_Word word_00;
  Col_Word CVar1;
  int iVar2;
  Col_Word CVar3;
  
  iVar2 = HasSynonymField(word);
  if (iVar2 != 0) {
    word_00 = *(Col_Word *)(word + 8);
    iVar2 = HasSynonymField(word_00);
    CVar1 = word_00;
    if (iVar2 != 0) {
      do {
        CVar3 = CVar1;
        CVar1 = *(Col_Word *)(CVar3 + 8);
      } while (CVar1 != word);
      *(Col_Word *)(CVar3 + 8) = word_00;
    }
    *(undefined8 *)(word + 8) = 0;
  }
  return;
}

Assistant:

void
Col_WordClearSynonym(
    Col_Word word)  /*!< The word to clear synonym for. */
{
    Col_Word synonym;

    if (!HasSynonymField(word)) {
        return;
    }

    synonym = WORD_SYNONYM(word);
    if (!HasSynonymField(synonym)) {
        /*
         * No synonym chain. Simply clear word's synonym field.
         */

        WORD_SYNONYM(word) = WORD_NIL;
        return;
    }

    /*
     * Find the synonym pointing back to this word, and remove word from the
     * chain.
     */

    while (WORD_SYNONYM(synonym) != word) {
        synonym = WORD_SYNONYM(synonym);
        ASSERT(HasSynonymField(synonym));
    }
    WORD_SYNONYM(synonym) = WORD_SYNONYM(word);
    WORD_SYNONYM(word) = WORD_NIL;
}